

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O3

void Nwk_ObjPatchFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFaninOld,Nwk_Obj_t *pFaninNew)

{
  Nwk_Obj_t *pNVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (pFaninOld == pFaninNew) {
    __assert_fail("pFaninOld != pFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xea,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj == pFaninOld) {
    __assert_fail("pObj != pFaninOld",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xeb,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj == pFaninNew) {
    __assert_fail("pObj != pFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xec,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj->pMan != pFaninOld->pMan) {
    __assert_fail("pObj->pMan == pFaninOld->pMan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xed,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj->pMan != pFaninNew->pMan) {
    __assert_fail("pObj->pMan == pFaninNew->pMan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xee,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (0 < (long)pObj->nFanins) {
    lVar5 = 0;
    do {
      pNVar1 = pObj->pFanio[lVar5];
      if (pNVar1 == (Nwk_Obj_t *)0x0) break;
      if (pNVar1 == pFaninOld) {
        pObj->pFanio[lVar5] = pFaninNew;
        iVar2 = pFaninOld->nFanouts;
        if (0 < iVar2) {
          iVar3 = pFaninOld->nFanins;
          iVar4 = iVar2 + iVar3;
          lVar5 = (long)iVar3;
          do {
            pNVar1 = pFaninOld->pFanio[lVar5];
            if (pNVar1 != pObj) {
              lVar6 = (long)iVar3;
              iVar3 = iVar3 + 1;
              pFaninOld->pFanio[lVar6] = pNVar1;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < iVar4);
        }
        pFaninOld->nFanouts = iVar2 + -1;
        iVar2 = pFaninNew->nFanouts;
        iVar4 = pFaninNew->nFanins + iVar2;
        if (iVar4 == pFaninNew->nFanioAlloc) {
          Nwk_ManReallocNode(pFaninNew);
          iVar2 = pFaninNew->nFanouts;
          iVar4 = pFaninNew->nFanins + iVar2;
        }
        pFaninNew->nFanouts = iVar2 + 1;
        pFaninNew->pFanio[iVar4] = pObj;
        return;
      }
      lVar5 = lVar5 + 1;
    } while (pObj->nFanins != lVar5);
  }
  printf("Nwk_ObjPatchFanin(); Error! Node %d is not among",(ulong)(uint)pFaninOld->Id);
  printf(" the fanins of node %d...\n",(ulong)(uint)pObj->Id);
  return;
}

Assistant:

void Nwk_ObjPatchFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFaninOld, Nwk_Obj_t * pFaninNew )
{
    int i, k, iFanin, Limit;
    assert( pFaninOld != pFaninNew );
    assert( pObj != pFaninOld );
    assert( pObj != pFaninNew );
    assert( pObj->pMan == pFaninOld->pMan );
    assert( pObj->pMan == pFaninNew->pMan );
    // update the fanin
    iFanin = Nwk_ObjFindFanin( pObj, pFaninOld );
    if ( iFanin == -1 )
    {
        printf( "Nwk_ObjPatchFanin(); Error! Node %d is not among", pFaninOld->Id );
        printf( " the fanins of node %d...\n", pObj->Id );
        return;
    }
    pObj->pFanio[iFanin] = pFaninNew;
    // remove pObj from the fanout list of pFaninOld
    Limit = pFaninOld->nFanins + pFaninOld->nFanouts;
    for ( k = i = pFaninOld->nFanins; i < Limit; i++ )
        if ( pFaninOld->pFanio[i] != pObj )
            pFaninOld->pFanio[k++] = pFaninOld->pFanio[i];
    pFaninOld->nFanouts--;
    // add pObj to the fanout list of pFaninNew
    if ( Nwk_ObjReallocIsNeeded(pFaninNew) )
        Nwk_ManReallocNode( pFaninNew );
    pFaninNew->pFanio[pFaninNew->nFanins + pFaninNew->nFanouts++] = pObj;
}